

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateCommandDefinitions_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  pointer pFVar1;
  pointer pEVar2;
  string *psVar3;
  ExtensionData *extension;
  pointer pEVar4;
  FeatureData *feature;
  pointer title;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string commandDefinitions;
  string commandDefinitionsTemplate;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listedCommands;
  allocator_type local_11a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_119;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "\n  //===========================\n  //=== COMMAND Definitions ===\n  //===========================\n\n${commandDefinitions}\n"
             ,"");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  title = (this->m_features).
          super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (title != pFVar1) {
    do {
      generateCommandDefinitions
                (&local_118.first,this,&title->requireData,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_90,&title->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_d8,local_118.first._M_dataplus._M_p,local_118.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.first._M_dataplus._M_p != &local_118.first.field_2) {
        operator_delete(local_118.first._M_dataplus._M_p,
                        local_118.first.field_2._M_allocated_capacity + 1);
      }
      title = title + 1;
    } while (title != pFVar1);
  }
  pEVar4 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar4 != pEVar2) {
    do {
      generateCommandDefinitions
                (&local_118.first,this,&pEVar4->requireData,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_90,&pEVar4->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_d8,local_118.first._M_dataplus._M_p,local_118.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.first._M_dataplus._M_p != &local_118.first.field_2) {
        operator_delete(local_118.first._M_dataplus._M_p,
                        local_118.first.field_2._M_allocated_capacity + 1);
      }
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar2);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[19],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_118,(char (*) [19])"commandDefinitions",&local_d8);
  __l._M_len = 1;
  __l._M_array = &local_118;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,&local_119,&local_11a);
  psVar3 = local_98;
  replaceWithMap(local_98,&local_b8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.second._M_dataplus._M_p != &local_118.second.field_2) {
    operator_delete(local_118.second._M_dataplus._M_p,
                    local_118.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.first._M_dataplus._M_p != &local_118.first.field_2) {
    operator_delete(local_118.first._M_dataplus._M_p,
                    local_118.first.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return psVar3;
}

Assistant:

std::string VulkanHppGenerator::generateCommandDefinitions() const
{
  const std::string commandDefinitionsTemplate = R"(
  //===========================
  //=== COMMAND Definitions ===
  //===========================

${commandDefinitions}
)";

  std::string           commandDefinitions;
  std::set<std::string> listedCommands;  // some commands are listed with more than one extension!
  for ( auto const & feature : m_features )
  {
    commandDefinitions += generateCommandDefinitions( feature.requireData, listedCommands, feature.name );
  }
  for ( auto const & extension : m_extensions )
  {
    commandDefinitions += generateCommandDefinitions( extension.requireData, listedCommands, extension.name );
  }

  return replaceWithMap( commandDefinitionsTemplate, { { "commandDefinitions", commandDefinitions } } );
}